

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.cc
# Opt level: O0

void __thiscall iqnet::Inet_addr::Impl::Impl(Impl *this,SystemSockAddrIn *s)

{
  uint16_t uVar1;
  pointer_type psVar2;
  char *pcVar3;
  SystemSockAddrIn *s_local;
  Impl *this_local;
  
  boost::optional<sockaddr_in>::optional(&this->sa,s);
  std::__cxx11::string::string((string *)&this->host);
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  pcVar3 = inet_ntoa((in_addr)(psVar2->sin_addr).s_addr);
  std::__cxx11::string::operator=((string *)&this->host,pcVar3);
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  uVar1 = ntohs(psVar2->sin_port);
  this->port = (uint)uVar1;
  return;
}

Assistant:

Inet_addr::Impl::Impl( const SystemSockAddrIn& s ):
  sa(s)
{
  host = inet_ntoa( sa->sin_addr );
  port = ntohs( sa->sin_port );
}